

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_ecdsa_adaptor.cpp
# Opt level: O0

Privkey * cfd::core::AdaptorUtil::ExtractSecret
                    (Privkey *__return_storage_ptr__,AdaptorSignature *adaptor_sig,
                    ByteData *signature,Pubkey *adaptor)

{
  pointer ctx_00;
  int iVar1;
  uchar *adaptor_secret32;
  uchar *adaptor_sig65;
  CfdException *this;
  ByteData local_150;
  undefined1 local_132;
  allocator local_131;
  string local_130;
  ByteData local_110;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f8;
  int local_e0;
  undefined1 local_dc [4];
  int ret;
  secp256k1_pubkey secp_adaptor;
  secp256k1_ecdsa_signature secp_sig;
  allocator<unsigned_char> local_49;
  undefined1 local_48 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> secret;
  secp256k1_context_struct *ctx;
  Pubkey *adaptor_local;
  ByteData *signature_local;
  AdaptorSignature *adaptor_sig_local;
  
  secret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)wally_get_secp_context();
  ::std::allocator<unsigned_char>::allocator(&local_49);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,0x20,&local_49);
  ::std::allocator<unsigned_char>::~allocator(&local_49);
  ParseSignature((secp256k1_ecdsa_signature *)(secp_adaptor.data + 0x38),signature);
  ParsePubkey((secp256k1_pubkey *)local_dc,adaptor);
  ctx_00 = secret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  adaptor_secret32 =
       ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  AdaptorSignature::GetData(&local_110,adaptor_sig);
  ByteData::GetBytes(&local_f8,&local_110);
  adaptor_sig65 =
       ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f8);
  iVar1 = secp256k1_ecdsa_adaptor_extract_secret
                    ((secp256k1_context *)ctx_00,adaptor_secret32,
                     (secp256k1_ecdsa_signature *)(secp_adaptor.data + 0x38),adaptor_sig65,
                     (secp256k1_pubkey *)local_dc);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f8);
  ByteData::~ByteData(&local_110);
  local_e0 = iVar1;
  if (iVar1 != 1) {
    local_132 = 1;
    this = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_130,"Could not extract secret.",&local_131);
    CfdException::CfdException(this,kCfdInternalError,&local_130);
    local_132 = 0;
    __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData::ByteData(&local_150,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  Privkey::Privkey(__return_storage_ptr__,&local_150,kMainnet,true);
  ByteData::~ByteData(&local_150);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Privkey AdaptorUtil::ExtractSecret(
    const AdaptorSignature &adaptor_sig, const ByteData &signature,
    const Pubkey &adaptor) {
  auto ctx = wally_get_secp_context();
  std::vector<uint8_t> secret(Privkey::kPrivkeySize);
  auto secp_sig = ParseSignature(signature);
  auto secp_adaptor = ParsePubkey(adaptor);
  auto ret = secp256k1_ecdsa_adaptor_extract_secret(
      ctx, secret.data(), &secp_sig, adaptor_sig.GetData().GetBytes().data(),
      &secp_adaptor);

  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdInternalError, "Could not extract secret.");
  }

  return Privkey(ByteData(secret));
}